

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fid_cgap.h
# Opt level: O0

ulint __thiscall bwtil::fid_cgap::fid_arrays_bytesize(fid_cgap *this)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  long in_RDI;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x118));
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x130));
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x148));
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 400));
  sVar5 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_00000010);
  sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x160));
  return sVar1 * 8 + sVar2 * 8 + sVar3 * 8 + sVar4 * 8 + (sVar5 >> 3) + 8 + sVar6 * 8;
}

Assistant:

ulint fid_arrays_bytesize(){
		return 	V_rank.size()*sizeof(ulint) +
				V_select.size()*sizeof(ulint) +
				R.size()*sizeof(ulint) +
				SEL.size()*sizeof(ulint) +
				V.size()/8 + sizeof(ulint) +
				R_1.size()*sizeof(ulint);
	}